

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O2

Int32 main(Int32 argc,Char **argv)

{
  ulong uVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Int32 extraout_EAX;
  size_t sVar7;
  FILE *pFVar8;
  BitStream *pBVar9;
  long lVar10;
  BitStream *bs;
  undefined8 *puVar11;
  int *piVar12;
  undefined8 extraout_RAX;
  undefined8 uVar13;
  undefined8 extraout_RAX_00;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  Int32 i;
  uint uVar17;
  Char *pCVar18;
  uint uVar19;
  char *pcVar20;
  FILE *__stream;
  undefined8 *puVar21;
  FILE *__stream_00;
  MaybeUInt64 MVar22;
  MaybeUInt64 MVar23;
  uint uVar24;
  
  strncpy(progName,*argv,1999);
  progName[1999] = '\0';
  outFileName[0] = '\0';
  inFileName[0] = '\0';
  fwrite("bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n",0x3d,1,_stderr);
  if (argc == 2) {
    pcVar20 = argv[1];
    sVar7 = strlen(pcVar20);
    if (sVar7 < 0x7bc) {
      strcpy(inFileName,pcVar20);
      pFVar8 = fopen(inFileName,"rb");
      if (pFVar8 == (FILE *)0x0) {
        pcVar20 = "%s: can\'t read `%s\'\n";
      }
      else {
        pBVar9 = bsOpenReadStream((FILE *)pFVar8);
        fprintf(_stderr,"%s: searching for block boundaries ...\n",progName);
        bStart[0] = 0;
        uVar24 = 0;
        uVar14 = 0;
        uVar15 = 0;
        iVar6 = 0;
        uVar19 = 0;
        while( true ) {
          MVar22 = uVar15;
          uVar15 = MVar22 + 1;
          IVar3 = bsGetBit(pBVar9);
          if (IVar3 == 2) break;
          uVar17 = uVar24 << 1;
          uVar4 = uVar14 >> 0x1f;
          uVar24 = uVar17 | uVar4;
          uVar14 = IVar3 + uVar14 * 2;
          uVar4 = uVar17 & 0xffff | uVar4;
          if ((uVar14 == 0x59265359 && uVar4 == 0x3141) || (uVar14 == 0x45385090 && uVar4 == 0x1772)
             ) {
            MVar22 = MVar22 - 0x30;
            if (uVar15 < 0x32) {
              MVar22 = 0;
            }
            bEnd[uVar19] = MVar22;
            iVar16 = iVar6;
            if (uVar19 != 0) {
              if (0x81 < MVar22 - bStart[uVar19]) {
                iVar16 = iVar6 + 1;
                fprintf(_stderr,"   block %d runs from %Lu to %Lu\n");
                rbStart[iVar6] = bStart[uVar19];
                rbEnd[iVar6] = bEnd[uVar19];
              }
              if (49999 < uVar19) {
                fprintf(_stderr,"%s: `%s\' appears to contain more than %d blocks\n",progName,
                        inFileName,50000);
                fprintf(_stderr,"%s: and cannot be handled.  To fix, increase\n",progName);
                pcVar20 = "%s: BZ_MAX_HANDLED_BLOCKS in bzip2recover.c, and recompile.\n";
                goto LAB_001018f5;
              }
            }
            bStart[(ulong)uVar19 + 1] = uVar15;
            iVar6 = iVar16;
            uVar19 = uVar19 + 1;
          }
        }
        uVar1 = bStart[uVar19];
        if (((uVar1 <= uVar15) && (0x27 < uVar15 - uVar1)) && (bEnd[uVar19] = MVar22, uVar19 != 0))
        {
          fprintf(_stderr,"   block %d runs from %Lu to %Lu (incomplete)\n",(ulong)uVar19,uVar1,
                  MVar22);
        }
        bsClose(pBVar9);
        if (iVar6 < 1) {
          pcVar20 = "%s: sorry, I couldn\'t find any block boundaries.\n";
LAB_001018f5:
          fprintf(_stderr,pcVar20,progName);
          goto LAB_00101945;
        }
        fprintf(_stderr,"%s: splitting into blocks\n",progName);
        pFVar8 = fopen(inFileName,"rb");
        if (pFVar8 != (FILE *)0x0) {
          pBVar9 = bsOpenReadStream((FILE *)pFVar8);
          bVar2 = true;
          bs = (BitStream *)0x0;
          iVar16 = 0;
          MVar22 = 0;
          uVar19 = 0;
LAB_001014f9:
          do {
            MVar23 = MVar22;
            while( true ) {
              IVar3 = bsGetBit(pBVar9);
              if (IVar3 == 2) goto LAB_001017f0;
              uVar24 = uVar24 << 1 | uVar14 >> 0x1f;
              if (MVar23 == rbStart[iVar16] + 0x2f) {
                uVar19 = uVar14 * 2 >> 0x10 | uVar24 << 0x10;
              }
              if ((rbStart[iVar16] <= MVar23 && !bVar2) && (MVar23 <= rbEnd[iVar16])) {
                bsPutBit(bs,IVar3);
              }
              uVar14 = IVar3 + uVar14 * 2;
              MVar22 = MVar23 + 1;
              if (MVar23 == rbEnd[iVar16]) break;
              MVar23 = MVar22;
              if (MVar22 == rbStart[iVar16]) goto LAB_00101623;
            }
            if (!bVar2) {
              bsPutUChar(bs,'\x17');
              bsPutUChar(bs,'r');
              bsPutUChar(bs,'E');
              bsPutUChar(bs,'8');
              bsPutUChar(bs,'P');
              bsPutUChar(bs,0x90);
              for (uVar17 = 0x1f; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
                bsPutBit(bs,(uint)((uVar19 >> (uVar17 & 0x1f) & 1) != 0));
              }
              bsClose(bs);
            }
            if (iVar6 <= iVar16) {
LAB_001017f0:
              fprintf(_stderr,"%s: finished\n",progName);
              return 0;
            }
            iVar16 = iVar16 + 1;
          } while( true );
        }
        pcVar20 = "%s: can\'t open `%s\'\n";
      }
      pCVar18 = inFileName;
LAB_0010193e:
      fprintf(_stderr,pcVar20,progName,pCVar18);
    }
    else {
      fprintf(_stderr,"%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",progName,
              sVar7 & 0xffffffff);
    }
  }
  else {
    fprintf(_stderr,"%s: usage is `%s damaged_file_name\'.\n",progName);
    fwrite("\trestrictions on size of recovered file: None\n",0x2e,1,_stderr);
  }
LAB_00101945:
  exit(1);
LAB_00101623:
  for (lVar10 = 0; lVar10 != 2000; lVar10 = lVar10 + 1) {
    outFileName[lVar10] = '\0';
  }
  strcpy(outFileName,inFileName);
  pcVar20 = strrchr(outFileName,0x2f);
  pCVar18 = pcVar20 + 1;
  if (pcVar20 == (char *)0x0) {
    pCVar18 = outFileName;
  }
  sprintf(pCVar18,"rec%5d");
  pcVar20 = pCVar18;
  do {
    if (*pcVar20 == ' ') {
      *pcVar20 = '0';
    }
    else if (*pcVar20 == '\0') break;
    pcVar20 = pcVar20 + 1;
  } while( true );
  strcat(outFileName,inFileName + ((int)pCVar18 + -0x1048b0));
  sVar7 = strlen(outFileName);
  iVar5 = (int)sVar7;
  if (((iVar5 < 5) || (outFileName[iVar5 - 4] != '.')) ||
     ((outFileName[iVar5 - 3] != 'b' ||
      ((outFileName[iVar5 - 2] != 'z' || (outFileName[iVar5 - 1] != '2')))))) {
    sVar7 = strlen(outFileName);
    builtin_memcpy(outFileName + sVar7,".bz2",4);
    outFileName[sVar7 + 4] = '\0';
  }
  fprintf(_stderr,"   writing block %d to `%s\' ...\n",(ulong)(iVar16 + 1),outFileName);
  uVar17 = 0;
  pFVar8 = fopen(outFileName,"wb");
  if (pFVar8 == (FILE *)0x0) {
    pcVar20 = "%s: can\'t write `%s\'\n";
    pCVar18 = outFileName;
    goto LAB_0010193e;
  }
  uVar13 = 0x18;
  bs = (BitStream *)malloc(0x18);
  if (bs != (BitStream *)0x0) {
    bs->handle = (FILE *)pFVar8;
    bs->buffer = 0;
    bs->buffLive = 0;
    bs->mode = 'w';
    bsPutUChar(bs,'B');
    bsPutUChar(bs,'Z');
    bsPutUChar(bs,'h');
    bsPutUChar(bs,'9');
    bsPutUChar(bs,'1');
    bsPutUChar(bs,'A');
    bsPutUChar(bs,'Y');
    bsPutUChar(bs,'&');
    bsPutUChar(bs,'S');
    bsPutUChar(bs,'Y');
    bVar2 = false;
    goto LAB_001014f9;
  }
  mallocFail((Int32)uVar13);
  puVar21 = (undefined8 *)0x18;
  puVar11 = (undefined8 *)malloc(0x18);
  if (puVar11 != (undefined8 *)0x0) {
    *puVar11 = uVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0x72;
    return (Int32)puVar11;
  }
  mallocFail((Int32)puVar21);
  if (0 < *(int *)((long)puVar21 + 0xc)) {
    uVar14 = *(int *)((long)puVar21 + 0xc) - 1;
    *(uint *)((long)puVar21 + 0xc) = uVar14;
    return (uint)((*(uint *)(puVar21 + 1) >> (uVar14 & 0x1f) & 1) != 0);
  }
  pFVar8 = (FILE *)*puVar21;
  uVar14 = getc(pFVar8);
  if (uVar14 != 0xffffffff) {
    *(undefined4 *)((long)puVar21 + 0xc) = 7;
    *(uint *)(puVar21 + 1) = uVar14;
    return uVar14 >> 7 & 1;
  }
  piVar12 = __errno_location();
  if (*piVar12 == 0) {
    return 2;
  }
  readError();
  if (*(char *)&pFVar8->_IO_read_end != 'w') goto LAB_00101a07;
  iVar6 = *(int *)((long)&pFVar8->_IO_read_ptr + 4);
  while (iVar6 < 8) {
    iVar6 = iVar6 + 1;
    *(int *)((long)&pFVar8->_IO_read_ptr + 4) = iVar6;
    *(int *)&pFVar8->_IO_read_ptr = *(int *)&pFVar8->_IO_read_ptr << 1;
  }
  __stream_00 = (FILE *)(ulong)*(byte *)&pFVar8->_IO_read_ptr;
  __stream = *(FILE **)pFVar8;
  iVar6 = putc((uint)*(byte *)&pFVar8->_IO_read_ptr,__stream);
  uVar17 = (uint)__stream;
  if (iVar6 != -1) {
    bytesOut = bytesOut + 1;
    __stream_00 = *(FILE **)pFVar8;
    iVar6 = fflush(__stream_00);
    if (iVar6 != -1) {
LAB_00101a07:
      __stream_00 = *(FILE **)pFVar8;
      iVar6 = fclose(__stream_00);
      if (iVar6 != -1) {
        free(pFVar8);
        return extraout_EAX;
      }
      if (*(char *)&pFVar8->_IO_read_end != 'w') goto LAB_00101a28;
    }
  }
  writeError();
LAB_00101a28:
  readError();
  iVar6 = *(int *)((long)&__stream_00->_IO_read_ptr + 4);
  if (iVar6 == 8) {
    uVar14 = *(uint *)&__stream_00->_IO_read_ptr & 0xff;
    pBVar9 = (BitStream *)(ulong)uVar14;
    pFVar8 = *(FILE **)__stream_00;
    iVar6 = putc(uVar14,pFVar8);
    uVar14 = (uint)pFVar8;
    if (iVar6 == -1) {
      writeError();
      uVar13 = extraout_RAX;
      for (uVar19 = 7; -1 < (int)uVar19; uVar19 = uVar19 - 1) {
        bsPutBit(pBVar9,(uint)((uVar14 >> (uVar19 & 0x1f) & 1) != 0));
        uVar13 = extraout_RAX_00;
      }
      return (Int32)uVar13;
    }
    bytesOut = bytesOut + 1;
    *(undefined4 *)((long)&__stream_00->_IO_read_ptr + 4) = 1;
    *(uint *)&__stream_00->_IO_read_ptr = uVar17 & 1;
  }
  else {
    *(uint *)&__stream_00->_IO_read_ptr = (uVar17 & 1) + *(uint *)&__stream_00->_IO_read_ptr * 2;
    iVar6 = iVar6 + 1;
    *(int *)((long)&__stream_00->_IO_read_ptr + 4) = iVar6;
  }
  return iVar6;
}

Assistant:

Int32 main ( Int32 argc, Char** argv )
{
   FILE*       inFile;
   FILE*       outFile;
   BitStream*  bsIn, *bsWr;
   Int32       b, wrBlock, currBlock, rbCtr;
   MaybeUInt64 bitsRead;

   UInt32      buffHi, buffLo, blockCRC;
   Char*       p;

   strncpy ( progName, argv[0], BZ_MAX_FILENAME-1);
   progName[BZ_MAX_FILENAME-1]='\0';
   inFileName[0] = outFileName[0] = 0;

   fprintf ( stderr, 
             "bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n" );

   if (argc != 2) {
      fprintf ( stderr, "%s: usage is `%s damaged_file_name'.\n",
                        progName, progName );
      switch (sizeof(MaybeUInt64)) {
         case 8:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: None\n");
            break;
         case 4:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: 512 MB\n");
            fprintf(stderr, 
                    "\tto circumvent, recompile with MaybeUInt64 as an\n"
                    "\tunsigned 64-bit int.\n");
            break;
         default:
            fprintf(stderr, 
                    "\tsizeof(MaybeUInt64) is not 4 or 8 -- "
                    "configuration error.\n");
            break;
      }
      exit(1);
   }

   if (strlen(argv[1]) >= BZ_MAX_FILENAME-20) {
      fprintf ( stderr, 
                "%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",
                progName, (int)strlen(argv[1]) );
      exit(1);
   }

   strcpy ( inFileName, argv[1] );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't read `%s'\n", progName, inFileName );
      exit(1);
   }

   bsIn = bsOpenReadStream ( inFile );
   fprintf ( stderr, "%s: searching for block boundaries ...\n", progName );

   bitsRead = 0;
   buffHi = buffLo = 0;
   currBlock = 0;
   bStart[currBlock] = 0;

   rbCtr = 0;

   while (True) {
      b = bsGetBit ( bsIn );
      bitsRead++;
      if (b == 2) {
         if (bitsRead >= bStart[currBlock] &&
            (bitsRead - bStart[currBlock]) >= 40) {
            bEnd[currBlock] = bitsRead-1;
            if (currBlock > 0)
               fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                                 " to " MaybeUInt64_FMT " (incomplete)\n",
                         currBlock,  bStart[currBlock], bEnd[currBlock] );
         } else
            currBlock--;
         break;
      }
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if ( ( (buffHi & 0x0000ffff) == BLOCK_HEADER_HI 
             && buffLo == BLOCK_HEADER_LO)
           || 
           ( (buffHi & 0x0000ffff) == BLOCK_ENDMARK_HI 
             && buffLo == BLOCK_ENDMARK_LO)
         ) {
         if (bitsRead > 49) {
            bEnd[currBlock] = bitsRead-49;
         } else {
            bEnd[currBlock] = 0;
         }
         if (currBlock > 0 &&
	     (bEnd[currBlock] - bStart[currBlock]) >= 130) {
            fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                              " to " MaybeUInt64_FMT "\n",
                      rbCtr+1,  bStart[currBlock], bEnd[currBlock] );
            rbStart[rbCtr] = bStart[currBlock];
            rbEnd[rbCtr] = bEnd[currBlock];
            rbCtr++;
         }
         if (currBlock >= BZ_MAX_HANDLED_BLOCKS)
            tooManyBlocks(BZ_MAX_HANDLED_BLOCKS);
         currBlock++;

         bStart[currBlock] = bitsRead;
      }
   }

   bsClose ( bsIn );

   /*-- identified blocks run from 1 to rbCtr inclusive. --*/

   if (rbCtr < 1) {
      fprintf ( stderr,
                "%s: sorry, I couldn't find any block boundaries.\n",
                progName );
      exit(1);
   };

   fprintf ( stderr, "%s: splitting into blocks\n", progName );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't open `%s'\n", progName, inFileName );
      exit(1);
   }
   bsIn = bsOpenReadStream ( inFile );

   /*-- placate gcc's dataflow analyser --*/
   blockCRC = 0; bsWr = 0;

   bitsRead = 0;
   outFile = NULL;
   wrBlock = 0;
   while (True) {
      b = bsGetBit(bsIn);
      if (b == 2) break;
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if (bitsRead == 47+rbStart[wrBlock]) 
         blockCRC = (buffHi << 16) | (buffLo >> 16);

      if (outFile != NULL && bitsRead >= rbStart[wrBlock]
                          && bitsRead <= rbEnd[wrBlock]) {
         bsPutBit ( bsWr, b );
      }

      bitsRead++;

      if (bitsRead == rbEnd[wrBlock]+1) {
         if (outFile != NULL) {
            bsPutUChar ( bsWr, 0x17 ); bsPutUChar ( bsWr, 0x72 );
            bsPutUChar ( bsWr, 0x45 ); bsPutUChar ( bsWr, 0x38 );
            bsPutUChar ( bsWr, 0x50 ); bsPutUChar ( bsWr, 0x90 );
            bsPutUInt32 ( bsWr, blockCRC );
            bsClose ( bsWr );
         }
         if (wrBlock >= rbCtr) break;
         wrBlock++;
      } else
      if (bitsRead == rbStart[wrBlock]) {
         /* Create the output file name, correctly handling leading paths. 
            (31.10.2001 by Sergey E. Kusikov) */
         Char* split;
         Int32 ofs, k;
         for (k = 0; k < BZ_MAX_FILENAME; k++) 
            outFileName[k] = 0;
         strcpy (outFileName, inFileName);
         split = strrchr (outFileName, BZ_SPLIT_SYM);
         if (split == NULL) {
            split = outFileName;
         } else {
            ++split;
	 }
	 /* Now split points to the start of the basename. */
         ofs  = split - outFileName;
         sprintf (split, "rec%5d", wrBlock+1);
         for (p = split; *p != 0; p++) if (*p == ' ') *p = '0';
         strcat (outFileName, inFileName + ofs);

         if ( !endsInBz2(outFileName)) strcat ( outFileName, ".bz2" );

         fprintf ( stderr, "   writing block %d to `%s' ...\n",
                           wrBlock+1, outFileName );

         outFile = fopen ( outFileName, "wb" );
         if (outFile == NULL) {
            fprintf ( stderr, "%s: can't write `%s'\n",
                      progName, outFileName );
            exit(1);
         }
         bsWr = bsOpenWriteStream ( outFile );
         bsPutUChar ( bsWr, BZ_HDR_B );    
         bsPutUChar ( bsWr, BZ_HDR_Z );    
         bsPutUChar ( bsWr, BZ_HDR_h );    
         bsPutUChar ( bsWr, BZ_HDR_0 + 9 );
         bsPutUChar ( bsWr, 0x31 ); bsPutUChar ( bsWr, 0x41 );
         bsPutUChar ( bsWr, 0x59 ); bsPutUChar ( bsWr, 0x26 );
         bsPutUChar ( bsWr, 0x53 ); bsPutUChar ( bsWr, 0x59 );
      }
   }

   fprintf ( stderr, "%s: finished\n", progName );
   return 0;
}